

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void Ssw_RarManAssingRandomPis(Ssw_RarMan_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  word *pwVar2;
  word wVar3;
  uint local_28;
  int local_24;
  int i;
  int w;
  Aig_Obj_t *pObj;
  word *pSim;
  Ssw_RarMan_t *p_local;
  
  for (local_28 = 0; iVar1 = Saig_ManPiNum(p->pAig), (int)local_28 < iVar1; local_28 = local_28 + 1)
  {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_28);
    iVar1 = Aig_ObjId(pObj_00);
    pwVar2 = Ssw_RarObjSim(p,iVar1);
    for (local_24 = 0; local_24 < p->pPars->nWords; local_24 = local_24 + 1) {
      wVar3 = Aig_ManRandom64(0);
      pwVar2[local_24] = wVar3;
    }
    iVar1 = 0xc;
    if ((local_28 & 1) != 0) {
      iVar1 = 10;
    }
    *pwVar2 = *pwVar2 << 4 | (long)iVar1;
  }
  return;
}

Assistant:

void Ssw_RarManAssingRandomPis( Ssw_RarMan_t * p )
{
    word * pSim;
    Aig_Obj_t * pObj;
    int w, i;
    Saig_ManForEachPi( p->pAig, pObj, i )
    {
        pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = Aig_ManRandom64(0);
//        pSim[0] <<= 1;
//        pSim[0] = (pSim[0] << 2) | 2;
        pSim[0] = (pSim[0] << 4) | ((i & 1) ? 0xA : 0xC);
    }
}